

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS
ref_shard_pair(REF_SHARD ref_shard,REF_BOOL *again,REF_INT a0,REF_INT a1,REF_INT b0,REF_INT b1)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL b_marked;
  REF_BOOL a_marked;
  REF_INT b1_local;
  REF_INT b0_local;
  REF_INT a1_local;
  REF_INT a0_local;
  REF_BOOL *again_local;
  REF_SHARD ref_shard_local;
  
  b_marked = b1;
  a_marked = b0;
  b1_local = a1;
  b0_local = a0;
  _a1_local = again;
  again_local = (REF_BOOL *)ref_shard;
  uVar1 = ref_shard_marked(ref_shard,a0,a1,&ref_private_macro_code_rss);
  if (uVar1 == 0) {
    uVar1 = ref_shard_marked((REF_SHARD)again_local,a_marked,b_marked,&ref_private_macro_code_rss_1)
    ;
    if (uVar1 == 0) {
      if (ref_private_macro_code_rss != ref_private_macro_code_rss_1) {
        *_a1_local = 1;
        uVar1 = ref_shard_mark_to_split((REF_SHARD)again_local,b0_local,b1_local);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0xdb,"ref_shard_pair",(ulong)uVar1,"mark a0-a1");
          return uVar1;
        }
        uVar1 = ref_shard_mark_to_split((REF_SHARD)again_local,a_marked,b_marked);
        if (uVar1 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0xdc,"ref_shard_pair",(ulong)uVar1,"mark b0-b1");
          return uVar1;
        }
      }
      ref_shard_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xd8,
             "ref_shard_pair",(ulong)uVar1,"marked? b0-b1");
      ref_shard_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",0xd7,
           "ref_shard_pair",(ulong)uVar1,"marked? a0-a1");
    ref_shard_local._4_4_ = uVar1;
  }
  return ref_shard_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_shard_pair(REF_SHARD ref_shard, REF_BOOL *again,
                                         REF_INT a0, REF_INT a1, REF_INT b0,
                                         REF_INT b1) {
  REF_BOOL a_marked, b_marked;

  RSS(ref_shard_marked(ref_shard, a0, a1, &a_marked), "marked? a0-a1");
  RSS(ref_shard_marked(ref_shard, b0, b1, &b_marked), "marked? b0-b1");
  if (a_marked != b_marked) {
    *again = REF_TRUE;
    RSS(ref_shard_mark_to_split(ref_shard, a0, a1), "mark a0-a1");
    RSS(ref_shard_mark_to_split(ref_shard, b0, b1), "mark b0-b1");
  }

  return REF_SUCCESS;
}